

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O0

void __thiscall LogFile::flush(LogFile *this)

{
  type _mutex;
  pointer this_00;
  MutexLockGuard local_18;
  MutexLockGuard lock;
  LogFile *this_local;
  
  lock.mutex = (MutexLock *)this;
  _mutex = std::unique_ptr<MutexLock,_std::default_delete<MutexLock>_>::operator*(&this->mutex_);
  MutexLockGuard::MutexLockGuard(&local_18,_mutex);
  this_00 = std::unique_ptr<AppendFile,_std::default_delete<AppendFile>_>::operator->(&this->file_);
  AppendFile::flush(this_00);
  MutexLockGuard::~MutexLockGuard(&local_18);
  return;
}

Assistant:

void LogFile::flush() {
    MutexLockGuard lock(*mutex_);
    file_->flush();
}